

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O2

void msdfgen::generateMSDF
               (Bitmap<msdfgen::FloatRGB> *output,Shape *shape,double range,Vector2 *scale,
               Vector2 *translate,double edgeThreshold)

{
  long lVar1;
  SignedDistance b;
  SignedDistance a;
  SignedDistance b_00;
  SignedDistance a_00;
  SignedDistance b_01;
  SignedDistance a_01;
  SignedDistance b_02;
  SignedDistance b_03;
  SignedDistance b_04;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  EdgeSegment *pEVar6;
  FloatRGB *pFVar7;
  long lVar8;
  EdgeHolder *this;
  uint uVar9;
  int iVar10;
  int i;
  uint y;
  ulong uVar11;
  pointer pCVar12;
  int iVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Vector2 VVar20;
  SignedDistance a_02;
  SignedDistance a_03;
  SignedDistance a_04;
  double local_208;
  double local_200;
  undefined8 local_1f8;
  double local_1e8;
  SignedDistance local_1b8;
  EdgeHolder *local_1a8;
  double dStack_1a0;
  SignedDistance local_198;
  EdgeHolder *local_188;
  double dStack_180;
  SignedDistance local_178;
  EdgeHolder *local_168;
  double dStack_160;
  EdgePoint sr;
  double param;
  uint local_11c;
  double local_118;
  undefined8 uStack_110;
  EdgePoint sg;
  vector<int,_std::allocator<int>_> windings;
  double local_a8;
  double local_98;
  EdgePoint sb;
  vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_> contourSD;
  
  uVar5 = ((long)(shape->contours).
                 super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(shape->contours).
                super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  iVar3 = Bitmap<msdfgen::FloatRGB>::width(output);
  uVar4 = Bitmap<msdfgen::FloatRGB>::height(output);
  windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar13 = (int)uVar5;
  std::vector<int,_std::allocator<int>_>::reserve(&windings,(long)iVar13);
  for (pCVar12 = (shape->contours).
                 super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pCVar12 !=
      (shape->contours).super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
      _M_impl.super__Vector_impl_data._M_finish; pCVar12 = pCVar12 + 1) {
    sr.minDistance.distance._0_4_ = Contour::winding(pCVar12);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&windings,(int *)&sr);
  }
  contourSD.super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contourSD.super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contourSD.super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::resize
            (&contourSD,(long)iVar13);
  uVar11 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar13 < 1) {
    uVar5 = uVar11;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  local_11c = 0;
  if (0 < (int)uVar4) {
    local_11c = uVar4;
  }
  lVar1 = uVar5 * 4;
  while (uVar9 = (uint)uVar11, uVar9 != local_11c) {
    y = ~uVar9 + uVar4;
    if (shape->inverseYAxis == false) {
      y = uVar9;
    }
    for (iVar13 = 0; iVar13 != iVar3; iVar13 = iVar13 + 1) {
      Vector2::Vector2((Vector2 *)&sg,(double)iVar13 + 0.5,(double)(int)uVar9 + 0.5);
      VVar20 = Vector2::operator/((Vector2 *)&sg,scale);
      sr.minDistance.dot = VVar20.y;
      sr.minDistance.distance._0_4_ = VVar20.x._0_4_;
      sr.minDistance.distance._4_4_ = VVar20.x._4_4_;
      VVar20 = Vector2::operator-((Vector2 *)&sr,translate);
      dVar17 = VVar20.y;
      SignedDistance::SignedDistance(&sr.minDistance);
      SignedDistance::SignedDistance(&sg.minDistance);
      SignedDistance::SignedDistance(&sb.minDistance);
      sb.nearEdge = (EdgeHolder *)0x0;
      sb.nearParam = 0.0;
      sg.nearEdge = (EdgeHolder *)0x0;
      sg.nearParam = 0.0;
      sr.nearEdge = (EdgeHolder *)0x0;
      sr.nearParam = 0.0;
      local_98 = 1e+240;
      local_118 = -1e+240;
      uStack_110 = 0;
      local_a8 = 1e+240;
      pCVar12 = (shape->contours).
                super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar10 = 0;
      for (uVar11 = 0; uVar14 = VVar20.x._0_4_, uVar11 != uVar5; uVar11 = uVar11 + 1) {
        SignedDistance::SignedDistance(&local_178);
        SignedDistance::SignedDistance(&local_198);
        SignedDistance::SignedDistance(&local_1b8);
        local_1a8 = (EdgeHolder *)0x0;
        dStack_1a0 = 0.0;
        local_188 = (EdgeHolder *)0x0;
        dStack_180 = 0.0;
        local_168 = (EdgeHolder *)0x0;
        dStack_160 = 0.0;
        for (this = *(EdgeHolder **)
                     &(pCVar12->edges).
                      super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>;
            this != (pCVar12->edges).
                    super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                    _M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
          pEVar6 = EdgeHolder::operator->(this);
          dVar18 = dVar17;
          (*pEVar6->_vptr_EdgeSegment[5])(uVar14,pEVar6,&param);
          dVar19 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          pEVar6 = EdgeHolder::operator->(this);
          if (((pEVar6->color & RED) != BLACK) &&
             (b_01.dot = local_178.dot, b_01.distance = local_178.distance, a_02.dot = dVar18,
             a_02.distance = dVar19, bVar2 = operator<(a_02,b_01), bVar2)) {
            dStack_160 = param;
            local_178.distance = dVar19;
            local_178.dot = dVar18;
            local_168 = this;
          }
          pEVar6 = EdgeHolder::operator->(this);
          if (((pEVar6->color & GREEN) != BLACK) &&
             (b_00.dot = local_198.dot, b_00.distance = local_198.distance, a_03.dot = dVar18,
             a_03.distance = dVar19, bVar2 = operator<(a_03,b_00), bVar2)) {
            dStack_180 = param;
            local_198.distance = dVar19;
            local_198.dot = dVar18;
            local_188 = this;
          }
          pEVar6 = EdgeHolder::operator->(this);
          if (((pEVar6->color & BLUE) != BLACK) &&
             (b.dot = local_1b8.dot, b.distance = local_1b8.distance, a_04.dot = dVar18,
             a_04.distance = dVar19, bVar2 = operator<(a_04,b), bVar2)) {
            dStack_1a0 = param;
            local_1b8.distance = dVar19;
            local_1b8.dot = dVar18;
            local_1a8 = this;
          }
        }
        a_01.dot = local_178.dot;
        a_01.distance = local_178.distance;
        b_02.distance._4_4_ = sr.minDistance.distance._4_4_;
        b_02.distance._0_4_ = sr.minDistance.distance._0_4_;
        b_02.dot = sr.minDistance.dot;
        bVar2 = operator<(a_01,b_02);
        if (bVar2) {
          sr.nearEdge = local_168;
          sr.nearParam = dStack_160;
          sr.minDistance.distance._0_4_ = SUB84(local_178.distance,0);
          sr.minDistance.distance._4_4_ = (undefined4)((ulong)local_178.distance >> 0x20);
          sr.minDistance.dot = local_178.dot;
        }
        a_00.dot = local_198.dot;
        a_00.distance = local_198.distance;
        b_03.dot = sg.minDistance.dot;
        b_03.distance = sg.minDistance.distance;
        bVar2 = operator<(a_00,b_03);
        if (bVar2) {
          sg.nearEdge = local_188;
          sg.nearParam = dStack_180;
          sg.minDistance.distance = local_198.distance;
          sg.minDistance.dot = local_198.dot;
        }
        a.dot = local_1b8.dot;
        a.distance = local_1b8.distance;
        b_04.dot = sb.minDistance.dot;
        b_04.distance = sb.minDistance.distance;
        bVar2 = operator<(a,b_04);
        if (bVar2) {
          sb.nearEdge = local_1a8;
          sb.nearParam = dStack_1a0;
          sb.minDistance.distance = local_1b8.distance;
          sb.minDistance.dot = local_1b8.dot;
        }
        uVar16 = SUB84(local_1b8.distance,0);
        uVar15 = (undefined4)((ulong)local_1b8.distance >> 0x20);
        dVar19 = local_198.distance;
        if (local_178.distance <= local_198.distance) {
          dVar19 = local_178.distance;
        }
        dVar18 = local_198.distance;
        if (local_198.distance <= local_178.distance) {
          dVar18 = local_178.distance;
        }
        if (dVar18 <= local_1b8.distance) {
          uVar16 = SUB84(dVar18,0);
          uVar15 = (undefined4)((ulong)dVar18 >> 0x20);
        }
        if ((double)CONCAT44(uVar15,uVar16) <= dVar19) {
          uVar16 = SUB84(dVar19,0);
          uVar15 = (undefined4)((ulong)dVar19 >> 0x20);
        }
        if (ABS((double)CONCAT44(uVar15,uVar16)) < local_98) {
          iVar10 = -windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
          local_98 = ABS((double)CONCAT44(uVar15,uVar16));
        }
        if (local_168 != (EdgeHolder *)0x0) {
          pEVar6 = EdgeHolder::operator->(local_168);
          (*pEVar6->_vptr_EdgeSegment[6])(uVar14,dVar17,dStack_160,pEVar6,&local_178);
        }
        if (local_188 != (EdgeHolder *)0x0) {
          pEVar6 = EdgeHolder::operator->(local_188);
          (*pEVar6->_vptr_EdgeSegment[6])(uVar14,dVar17,dStack_180,pEVar6,&local_198);
        }
        if (local_1a8 != (EdgeHolder *)0x0) {
          pEVar6 = EdgeHolder::operator->(local_1a8);
          (*pEVar6->_vptr_EdgeSegment[6])(uVar14,dVar17,dStack_1a0,pEVar6,&local_1b8);
        }
        contourSD.
        super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11].r = local_178.distance;
        contourSD.
        super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11].g = local_198.distance;
        dVar19 = local_198.distance;
        if (local_178.distance <= local_198.distance) {
          dVar19 = local_178.distance;
        }
        dVar18 = local_198.distance;
        if (local_198.distance <= local_178.distance) {
          dVar18 = local_178.distance;
        }
        contourSD.
        super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11].b = local_1b8.distance;
        uVar14 = SUB84(local_1b8.distance,0);
        uVar16 = (undefined4)((ulong)local_1b8.distance >> 0x20);
        if (dVar18 <= local_1b8.distance) {
          uVar14 = SUB84(dVar18,0);
          uVar16 = (undefined4)((ulong)dVar18 >> 0x20);
        }
        if ((double)CONCAT44(uVar16,uVar14) <= dVar19) {
          uVar14 = SUB84(dVar19,0);
          uVar16 = (undefined4)((ulong)dVar19 >> 0x20);
        }
        contourSD.
        super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11].med = (double)CONCAT44(uVar16,uVar14);
        if ((double)CONCAT44(uVar16,uVar14) < 0.0 ||
            windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11] < 1) {
          if (((double)CONCAT44(uVar16,uVar14) <= 0.0 &&
               windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11] < 0) &&
             (ABS((double)CONCAT44(uVar16,uVar14)) < ABS(local_a8))) {
            local_a8 = (double)CONCAT44(uVar16,uVar14);
          }
        }
        else if (ABS((double)CONCAT44(uVar16,uVar14)) < ABS(local_118)) {
          local_118 = (double)CONCAT44(uVar16,uVar14);
          uStack_110 = 0;
        }
        pCVar12 = pCVar12 + 1;
      }
      if (sr.nearEdge != (EdgeHolder *)0x0) {
        pEVar6 = EdgeHolder::operator->(sr.nearEdge);
        (*pEVar6->_vptr_EdgeSegment[6])(uVar14,dVar17,sr.nearParam,pEVar6,&sr);
      }
      if (sg.nearEdge != (EdgeHolder *)0x0) {
        pEVar6 = EdgeHolder::operator->(sg.nearEdge);
        (*pEVar6->_vptr_EdgeSegment[6])(uVar14,dVar17,sg.nearParam,pEVar6,&sg);
      }
      if (sb.nearEdge != (EdgeHolder *)0x0) {
        pEVar6 = EdgeHolder::operator->(sb.nearEdge);
        (*pEVar6->_vptr_EdgeSegment[6])(uVar14,dVar17,sb.nearParam,pEVar6,&sb);
      }
      local_1f8 = -1e+240;
      if ((local_118 < 0.0) || (ABS(local_a8) < ABS(local_118))) {
        if ((0.0 < local_a8) || (ABS(local_118) < ABS(local_a8))) {
          local_208 = -1e+240;
          local_200 = -1e+240;
          local_1e8 = -1e+240;
        }
        else {
          uVar16 = 0x71c33234;
          uVar14 = 0xde7ad7e3;
          local_208 = -1e+240;
          local_200 = -1e+240;
          local_1e8 = -1e+240;
          for (lVar8 = 0; lVar1 - lVar8 != 0; lVar8 = lVar8 + 4) {
            if (((*(int *)((long)windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar8) < 0) &&
                (dVar17 = (&(contourSD.
                             super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                             ._M_impl.super__Vector_impl_data._M_start)->med)[lVar8],
                dVar17 <= (double)CONCAT44(uVar16,uVar14) &&
                (double)CONCAT44(uVar16,uVar14) != dVar17)) && (ABS(dVar17) < ABS(local_118))) {
              local_1e8 = (&(contourSD.
                             super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                             ._M_impl.super__Vector_impl_data._M_start)->r)[lVar8];
              local_200 = (&(contourSD.
                             super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                             ._M_impl.super__Vector_impl_data._M_start)->g)[lVar8];
              local_208 = (&(contourSD.
                             super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                             ._M_impl.super__Vector_impl_data._M_start)->b)[lVar8];
              uVar14 = SUB84(dVar17,0);
              uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
            }
          }
          iVar10 = -1;
          local_1f8 = (double)CONCAT44(uVar16,uVar14);
        }
      }
      else {
        local_208 = -1e+240;
        local_200 = -1e+240;
        local_1e8 = -1e+240;
        for (lVar8 = 0; lVar1 - lVar8 != 0; lVar8 = lVar8 + 4) {
          if (((0 < *(int *)((long)windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar8)) &&
              (dVar17 = (&(contourSD.
                           super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                           ._M_impl.super__Vector_impl_data._M_start)->med)[lVar8],
              local_1f8 < dVar17)) && (ABS(dVar17) < ABS(local_a8))) {
            local_1e8 = (&(contourSD.
                           super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                           ._M_impl.super__Vector_impl_data._M_start)->r)[lVar8];
            local_200 = (&(contourSD.
                           super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                           ._M_impl.super__Vector_impl_data._M_start)->g)[lVar8];
            local_208 = (&(contourSD.
                           super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                           ._M_impl.super__Vector_impl_data._M_start)->b)[lVar8];
            local_1f8 = dVar17;
          }
        }
        iVar10 = 1;
      }
      for (lVar8 = 0; lVar1 - lVar8 != 0; lVar8 = lVar8 + 4) {
        if ((*(int *)((long)windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar8) != iVar10) &&
           (ABS((&(contourSD.
                   super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                   ._M_impl.super__Vector_impl_data._M_start)->med)[lVar8]) < ABS(local_1f8))) {
          local_1e8 = (&(contourSD.
                         super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                         ._M_impl.super__Vector_impl_data._M_start)->r)[lVar8];
          local_200 = (&(contourSD.
                         super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                         ._M_impl.super__Vector_impl_data._M_start)->g)[lVar8];
          local_208 = (&(contourSD.
                         super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                         ._M_impl.super__Vector_impl_data._M_start)->b)[lVar8];
          local_1f8 = (&(contourSD.
                         super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                         ._M_impl.super__Vector_impl_data._M_start)->med)[lVar8];
        }
      }
      dVar17 = (double)CONCAT44(sr.minDistance.distance._4_4_,sr.minDistance.distance._0_4_);
      dVar19 = sg.minDistance.distance;
      if (dVar17 <= sg.minDistance.distance) {
        dVar19 = dVar17;
      }
      dVar18 = sg.minDistance.distance;
      if (sg.minDistance.distance <= dVar17) {
        dVar18 = dVar17;
      }
      local_118 = sb.minDistance.distance;
      if (dVar18 <= sb.minDistance.distance) {
        local_118 = dVar18;
      }
      if (local_118 <= dVar19) {
        local_118 = dVar19;
      }
      uStack_110 = 0;
      if ((local_118 == local_1f8) && (!NAN(local_118) && !NAN(local_1f8))) {
        local_208 = sb.minDistance.distance;
      }
      if ((local_118 == local_1f8) && (!NAN(local_118) && !NAN(local_1f8))) {
        local_200 = sg.minDistance.distance;
      }
      pFVar7 = Bitmap<msdfgen::FloatRGB>::operator()(output,iVar13,y);
      pFVar7->r = (float)((double)(~-(ulong)(local_118 == local_1f8) & (ulong)local_1e8 |
                                  (ulong)dVar17 & -(ulong)(local_118 == local_1f8)) / range + 0.5);
      pFVar7 = Bitmap<msdfgen::FloatRGB>::operator()(output,iVar13,y);
      pFVar7->g = (float)(local_200 / range + 0.5);
      pFVar7 = Bitmap<msdfgen::FloatRGB>::operator()(output,iVar13,y);
      pFVar7->b = (float)(local_208 / range + 0.5);
    }
    uVar11 = (ulong)(uVar9 + 1);
  }
  std::_Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::~_Vector_base
            (&contourSD.
              super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>);
  if (0.0 < edgeThreshold) {
    VVar20 = Vector2::operator*(scale,range);
    sg.minDistance.dot = VVar20.y;
    sg.minDistance.distance = VVar20.x;
    VVar20 = operator/(edgeThreshold,(Vector2 *)&sg);
    sr.minDistance.dot = VVar20.y;
    sr.minDistance.distance._0_4_ = VVar20.x._0_4_;
    sr.minDistance.distance._4_4_ = VVar20.x._4_4_;
    msdfErrorCorrection(output,(Vector2 *)&sr);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&windings.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void generateMSDF(Bitmap<FloatRGB> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate, double edgeThreshold) {
    int contourCount = shape.contours.size();
    int w = output.width(), h = output.height();
    std::vector<int> windings;
    windings.reserve(contourCount);
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
        windings.push_back(contour->winding());

#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel
#endif
    {
        std::vector<MultiDistance> contourSD;
        contourSD.resize(contourCount);
#ifdef MSDFGEN_USE_OPENMP
        #pragma omp for
#endif
        for (int y = 0; y < h; ++y) {
            int row = shape.inverseYAxis ? h-y-1 : y;
            for (int x = 0; x < w; ++x) {
                Point2 p = Vector2(x+.5, y+.5)/scale-translate;

                struct EdgePoint {
                    SignedDistance minDistance;
                    const EdgeHolder *nearEdge;
                    double nearParam;
                } sr, sg, sb;
                sr.nearEdge = sg.nearEdge = sb.nearEdge = NULL;
                sr.nearParam = sg.nearParam = sb.nearParam = 0;
                double d = fabs(SignedDistance::INFINITE.distance);
                double negDist = -SignedDistance::INFINITE.distance;
                double posDist = SignedDistance::INFINITE.distance;
                int winding = 0;

                std::vector<Contour>::const_iterator contour = shape.contours.begin();
                for (int i = 0; i < contourCount; ++i, ++contour) {
                    EdgePoint r, g, b;
                    r.nearEdge = g.nearEdge = b.nearEdge = NULL;
                    r.nearParam = g.nearParam = b.nearParam = 0;

                    for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                        double param;
                        SignedDistance distance = (*edge)->signedDistance(p, param);
                        if ((*edge)->color&RED && distance < r.minDistance) {
                            r.minDistance = distance;
                            r.nearEdge = &*edge;
                            r.nearParam = param;
                        }
                        if ((*edge)->color&GREEN && distance < g.minDistance) {
                            g.minDistance = distance;
                            g.nearEdge = &*edge;
                            g.nearParam = param;
                        }
                        if ((*edge)->color&BLUE && distance < b.minDistance) {
                            b.minDistance = distance;
                            b.nearEdge = &*edge;
                            b.nearParam = param;
                        }
                    }
                    if (r.minDistance < sr.minDistance)
                        sr = r;
                    if (g.minDistance < sg.minDistance)
                        sg = g;
                    if (b.minDistance < sb.minDistance)
                        sb = b;

                    double medMinDistance = fabs(median(r.minDistance.distance, g.minDistance.distance, b.minDistance.distance));
                    if (medMinDistance < d) {
                        d = medMinDistance;
                        winding = -windings[i];
                    }
                    if (r.nearEdge)
                        (*r.nearEdge)->distanceToPseudoDistance(r.minDistance, p, r.nearParam);
                    if (g.nearEdge)
                        (*g.nearEdge)->distanceToPseudoDistance(g.minDistance, p, g.nearParam);
                    if (b.nearEdge)
                        (*b.nearEdge)->distanceToPseudoDistance(b.minDistance, p, b.nearParam);
                    medMinDistance = median(r.minDistance.distance, g.minDistance.distance, b.minDistance.distance);
                    contourSD[i].r = r.minDistance.distance;
                    contourSD[i].g = g.minDistance.distance;
                    contourSD[i].b = b.minDistance.distance;
                    contourSD[i].med = medMinDistance;
                    if (windings[i] > 0 && medMinDistance >= 0 && fabs(medMinDistance) < fabs(posDist))
                        posDist = medMinDistance;
                    if (windings[i] < 0 && medMinDistance <= 0 && fabs(medMinDistance) < fabs(negDist))
                        negDist = medMinDistance;
                }
                if (sr.nearEdge)
                    (*sr.nearEdge)->distanceToPseudoDistance(sr.minDistance, p, sr.nearParam);
                if (sg.nearEdge)
                    (*sg.nearEdge)->distanceToPseudoDistance(sg.minDistance, p, sg.nearParam);
                if (sb.nearEdge)
                    (*sb.nearEdge)->distanceToPseudoDistance(sb.minDistance, p, sb.nearParam);

                MultiDistance msd;
                msd.r = msd.g = msd.b = msd.med = SignedDistance::INFINITE.distance;
                if (posDist >= 0 && fabs(posDist) <= fabs(negDist)) {
                    msd.med = SignedDistance::INFINITE.distance;
                    winding = 1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] > 0 && contourSD[i].med > msd.med && fabs(contourSD[i].med) < fabs(negDist))
                            msd = contourSD[i];
                } else if (negDist <= 0 && fabs(negDist) <= fabs(posDist)) {
                    msd.med = -SignedDistance::INFINITE.distance;
                    winding = -1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] < 0 && contourSD[i].med < msd.med && fabs(contourSD[i].med) < fabs(posDist))
                            msd = contourSD[i];
                }
                for (int i = 0; i < contourCount; ++i)
                    if (windings[i] != winding && fabs(contourSD[i].med) < fabs(msd.med))
                        msd = contourSD[i];
                if (median(sr.minDistance.distance, sg.minDistance.distance, sb.minDistance.distance) == msd.med) {
                    msd.r = sr.minDistance.distance;
                    msd.g = sg.minDistance.distance;
                    msd.b = sb.minDistance.distance;
                }

                output(x, row).r = float(msd.r/range+.5);
                output(x, row).g = float(msd.g/range+.5);
                output(x, row).b = float(msd.b/range+.5);
            }
        }
    }

    if (edgeThreshold > 0)
        msdfErrorCorrection(output, edgeThreshold/(scale*range));
}